

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# by_dir.cc
# Opt level: O0

int get_cert_by_subject(X509_LOOKUP *xl,int type,X509_NAME *name,X509_OBJECT *ret)

{
  undefined8 *puVar1;
  int iVar2;
  ulong uVar3;
  size_t sVar4;
  CRYPTO_MUTEX *lock;
  BY_DIR_HASH *p;
  BY_DIR_HASH *local_1d8;
  BY_DIR_HASH *hent;
  BY_DIR_HASH htmp;
  size_t idx;
  BY_DIR_ENTRY *ent;
  BY_DIR *ctx;
  char *postfix;
  X509_OBJECT *tmp;
  X509_OBJECT stmp;
  char *b;
  uint32_t local_180;
  int hash_index;
  uint32_t hash_array [2];
  uint32_t h;
  int k;
  size_t i;
  stack_st_DIST_POINT **ppsStack_160;
  int ok;
  anon_union_304_2_131d70c8 data;
  X509_OBJECT *ret_local;
  X509_NAME *name_local;
  X509_LOOKUP *pXStack_18;
  int type_local;
  X509_LOOKUP *xl_local;
  
  i._4_4_ = 0;
  stmp.data.ptr = (char *)0x0;
  if (name == (X509_NAME *)0x0) {
    return 0;
  }
  puVar1 = (undefined8 *)xl->method_data;
  tmp._0_4_ = type;
  data.x509.st_x509_cinf.enc.buf = (CRYPTO_BUFFER *)ret;
  ret_local = (X509_OBJECT *)name;
  name_local._4_4_ = type;
  pXStack_18 = (X509_LOOKUP *)xl;
  if (type == 1) {
    ppsStack_160 = (stack_st_DIST_POINT **)((long)&data.x509.st_x509.lock + 0x30);
    ctx = (BY_DIR *)0x2fe8b2;
    data.x509.st_x509_cinf.validity = (X509_VAL *)name;
  }
  else {
    if (type != 2) {
      ERR_put_error(0xb,0,0x85,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/by_dir.cc"
                    ,0xe8);
      goto LAB_002dc313;
    }
    ppsStack_160 = &data.x509.st_x509.crldp;
    ctx = (BY_DIR *)0x35b290;
    data.x509.st_x509.nc = (NAME_CONSTRAINTS *)name;
  }
  stmp._0_8_ = &stack0xfffffffffffffea0;
  uVar3 = X509_NAME_hash((X509_NAME *)name);
  local_180 = (uint32_t)uVar3;
  uVar3 = X509_NAME_hash_old((X509_NAME *)ret_local);
  hash_index = (int)uVar3;
  for (b._4_4_ = 0; b._4_4_ < 2; b._4_4_ = b._4_4_ + 1) {
    hash_array[0] = (&local_180)[b._4_4_];
    _h = 0;
LAB_002dbec2:
    sVar4 = sk_BY_DIR_ENTRY_num((stack_st_BY_DIR_ENTRY *)*puVar1);
    if (_h < sVar4) {
      lock = &sk_BY_DIR_ENTRY_value((stack_st_BY_DIR_ENTRY *)*puVar1,_h)->lock;
      if ((name_local._4_4_ == 2) && (*(long *)((long)lock + 0x48) != 0)) {
        hent._0_4_ = hash_array[0];
        CRYPTO_MUTEX_lock_read(lock);
        iVar2 = sk_BY_DIR_HASH_find(*(stack_st_BY_DIR_HASH **)((long)lock + 0x48),(size_t *)&htmp,
                                    (BY_DIR_HASH *)&hent);
        if (iVar2 == 0) {
          local_1d8 = (BY_DIR_HASH *)0x0;
          hash_array[1] = 0;
        }
        else {
          local_1d8 = sk_BY_DIR_HASH_value
                                (*(stack_st_BY_DIR_HASH **)((long)lock + 0x48),(size_t)htmp);
          hash_array[1] = local_1d8->suffix;
        }
        CRYPTO_MUTEX_unlock_read(lock);
      }
      else {
        hash_array[1] = 0;
        local_1d8 = (BY_DIR_HASH *)0x0;
      }
      do {
        OPENSSL_free(stmp.data.ptr);
        iVar2 = OPENSSL_asprintf(&stmp.data.ptr,"%s/%08x.%s%d",lock[1].__align,(ulong)hash_array[0],
                                 ctx,(ulong)hash_array[1]);
        if (iVar2 == -1) {
          ERR_put_error(0xb,0,7,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/by_dir.cc"
                        ,0x108);
          stmp.data.ptr = (char *)0x0;
          goto LAB_002dc313;
        }
        if (name_local._4_4_ == 1) {
          iVar2 = X509_load_cert_file(pXStack_18,stmp.data.ptr,*(int *)((long)lock + 0x40));
          if (iVar2 == 0) {
            ERR_clear_error();
            goto LAB_002dc0b5;
          }
        }
        else if ((name_local._4_4_ == 2) &&
                (iVar2 = X509_load_crl_file(pXStack_18,stmp.data.ptr,*(int *)((long)lock + 0x40)),
                iVar2 == 0)) goto code_r0x002dc096;
        hash_array[1] = hash_array[1] + 1;
      } while( true );
    }
  }
LAB_002dc313:
  OPENSSL_free(stmp.data.ptr);
  return i._4_4_;
code_r0x002dc096:
  ERR_clear_error();
LAB_002dc0b5:
  CRYPTO_MUTEX_lock_write(&((X509_STORE *)pXStack_18->method_data)->objs_lock);
  postfix = (char *)0x0;
  sk_X509_OBJECT_sort(((X509_STORE *)pXStack_18->method_data)->objs);
  iVar2 = sk_X509_OBJECT_find(((X509_STORE *)pXStack_18->method_data)->objs,(size_t *)&htmp,
                              (X509_OBJECT *)&tmp);
  if (iVar2 != 0) {
    postfix = (char *)sk_X509_OBJECT_value
                                (((X509_STORE *)pXStack_18->method_data)->objs,(size_t)htmp);
  }
  CRYPTO_MUTEX_unlock_write(&((X509_STORE *)pXStack_18->method_data)->objs_lock);
  if (name_local._4_4_ == 2) {
    CRYPTO_MUTEX_lock_write(lock);
    if (local_1d8 == (BY_DIR_HASH *)0x0) {
      hent._0_4_ = hash_array[0];
      sk_BY_DIR_HASH_sort(*(stack_st_BY_DIR_HASH **)((long)lock + 0x48));
      iVar2 = sk_BY_DIR_HASH_find(*(stack_st_BY_DIR_HASH **)((long)lock + 0x48),(size_t *)&htmp,
                                  (BY_DIR_HASH *)&hent);
      if (iVar2 != 0) {
        local_1d8 = sk_BY_DIR_HASH_value(*(stack_st_BY_DIR_HASH **)((long)lock + 0x48),(size_t)htmp)
        ;
      }
    }
    if (local_1d8 == (BY_DIR_HASH *)0x0) {
      p = (BY_DIR_HASH *)OPENSSL_malloc(8);
      if (p == (BY_DIR_HASH *)0x0) {
        CRYPTO_MUTEX_unlock_write(lock);
        i._4_4_ = 0;
        goto LAB_002dc313;
      }
      p->hash = hash_array[0];
      p->suffix = hash_array[1];
      sVar4 = sk_BY_DIR_HASH_push(*(stack_st_BY_DIR_HASH **)((long)lock + 0x48),p);
      if (sVar4 == 0) {
        CRYPTO_MUTEX_unlock_write(lock);
        OPENSSL_free(p);
        i._4_4_ = 0;
        goto LAB_002dc313;
      }
      sk_BY_DIR_HASH_sort(*(stack_st_BY_DIR_HASH **)((long)lock + 0x48));
    }
    else if (local_1d8->suffix < (int)hash_array[1]) {
      local_1d8->suffix = hash_array[1];
    }
    CRYPTO_MUTEX_unlock_write(lock);
  }
  if (postfix != (char *)0x0) {
    i._4_4_ = 1;
    *(undefined4 *)&(data.x509.st_x509_cinf.enc.buf)->pool = *(undefined4 *)postfix;
    OPENSSL_memcpy(&(data.x509.st_x509_cinf.enc.buf)->data,postfix + 8,8);
    ERR_clear_error();
    goto LAB_002dc313;
  }
  _h = _h + 1;
  goto LAB_002dbec2;
}

Assistant:

static int get_cert_by_subject(X509_LOOKUP *xl, int type, X509_NAME *name,
                               X509_OBJECT *ret) {
  union {
    struct {
      X509 st_x509;
      X509_CINF st_x509_cinf;
    } x509;
    struct {
      X509_CRL st_crl;
      X509_CRL_INFO st_crl_info;
    } crl;
  } data;
  int ok = 0;
  size_t i;
  int k;
  uint32_t h;
  uint32_t hash_array[2];
  int hash_index;
  char *b = NULL;
  X509_OBJECT stmp, *tmp;
  const char *postfix = "";

  if (name == NULL) {
    return 0;
  }

  stmp.type = type;
  BY_DIR *ctx = reinterpret_cast<BY_DIR *>(xl->method_data);
  if (type == X509_LU_X509) {
    data.x509.st_x509.cert_info = &data.x509.st_x509_cinf;
    data.x509.st_x509_cinf.subject = name;
    stmp.data.x509 = &data.x509.st_x509;
    postfix = "";
  } else if (type == X509_LU_CRL) {
    data.crl.st_crl.crl = &data.crl.st_crl_info;
    data.crl.st_crl_info.issuer = name;
    stmp.data.crl = &data.crl.st_crl;
    postfix = "r";
  } else {
    OPENSSL_PUT_ERROR(X509, X509_R_WRONG_LOOKUP_TYPE);
    goto finish;
  }

  hash_array[0] = X509_NAME_hash(name);
  hash_array[1] = X509_NAME_hash_old(name);
  for (hash_index = 0; hash_index < 2; ++hash_index) {
    h = hash_array[hash_index];
    for (i = 0; i < sk_BY_DIR_ENTRY_num(ctx->dirs); i++) {
      BY_DIR_ENTRY *ent;
      size_t idx;
      BY_DIR_HASH htmp, *hent;
      ent = sk_BY_DIR_ENTRY_value(ctx->dirs, i);
      if (type == X509_LU_CRL && ent->hashes) {
        htmp.hash = h;
        CRYPTO_MUTEX_lock_read(&ent->lock);
        if (sk_BY_DIR_HASH_find(ent->hashes, &idx, &htmp)) {
          hent = sk_BY_DIR_HASH_value(ent->hashes, idx);
          k = hent->suffix;
        } else {
          hent = NULL;
          k = 0;
        }
        CRYPTO_MUTEX_unlock_read(&ent->lock);
      } else {
        k = 0;
        hent = NULL;
      }
      for (;;) {
        OPENSSL_free(b);
        if (OPENSSL_asprintf(&b, "%s/%08" PRIx32 ".%s%d", ent->dir, h, postfix,
                             k) == -1) {
          OPENSSL_PUT_ERROR(X509, ERR_R_BUF_LIB);
          b = nullptr;
          goto finish;
        }
        if (type == X509_LU_X509) {
          if ((X509_load_cert_file(xl, b, ent->dir_type)) == 0) {
            // Don't expose the lower level error, All of these boil
            // down to "we could not find a CA".
            ERR_clear_error();
            break;
          }
        } else if (type == X509_LU_CRL) {
          if ((X509_load_crl_file(xl, b, ent->dir_type)) == 0) {
            // Don't expose the lower level error, All of these boil
            // down to "we could not find a CRL".
            ERR_clear_error();
            break;
          }
        }
        // The lack of a CA or CRL will be caught higher up
        k++;
      }

      // we have added it to the cache so now pull it out again
      CRYPTO_MUTEX_lock_write(&xl->store_ctx->objs_lock);
      tmp = NULL;
      sk_X509_OBJECT_sort(xl->store_ctx->objs);
      if (sk_X509_OBJECT_find(xl->store_ctx->objs, &idx, &stmp)) {
        tmp = sk_X509_OBJECT_value(xl->store_ctx->objs, idx);
      }
      CRYPTO_MUTEX_unlock_write(&xl->store_ctx->objs_lock);

      // If a CRL, update the last file suffix added for this

      if (type == X509_LU_CRL) {
        CRYPTO_MUTEX_lock_write(&ent->lock);
        // Look for entry again in case another thread added an entry
        // first.
        if (!hent) {
          htmp.hash = h;
          sk_BY_DIR_HASH_sort(ent->hashes);
          if (sk_BY_DIR_HASH_find(ent->hashes, &idx, &htmp)) {
            hent = sk_BY_DIR_HASH_value(ent->hashes, idx);
          }
        }
        if (!hent) {
          hent = reinterpret_cast<BY_DIR_HASH *>(
              OPENSSL_malloc(sizeof(BY_DIR_HASH)));
          if (hent == NULL) {
            CRYPTO_MUTEX_unlock_write(&ent->lock);
            ok = 0;
            goto finish;
          }
          hent->hash = h;
          hent->suffix = k;
          if (!sk_BY_DIR_HASH_push(ent->hashes, hent)) {
            CRYPTO_MUTEX_unlock_write(&ent->lock);
            OPENSSL_free(hent);
            ok = 0;
            goto finish;
          }
          sk_BY_DIR_HASH_sort(ent->hashes);
        } else if (hent->suffix < k) {
          hent->suffix = k;
        }

        CRYPTO_MUTEX_unlock_write(&ent->lock);
      }

      if (tmp != NULL) {
        ok = 1;
        ret->type = tmp->type;
        OPENSSL_memcpy(&ret->data, &tmp->data, sizeof(ret->data));

        // Clear any errors that might have been raised processing empty
        // or malformed files.
        ERR_clear_error();

        // If we were going to up the reference count, we would need
        // to do it on a perl 'type' basis
        goto finish;
      }
    }
  }
finish:
  OPENSSL_free(b);
  return ok;
}